

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O3

int __thiscall ncnn::BinaryOp::load_param(BinaryOp *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->op_type = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->with_scalar = iVar1;
  fVar2 = ParamDict::get(pd,2,0.0);
  this->b = fVar2;
  if (this->with_scalar != 0) {
    (this->super_Layer).one_blob_only = true;
    (this->super_Layer).support_inplace = true;
  }
  return 0;
}

Assistant:

int BinaryOp::load_param(const ParamDict& pd)
{
    op_type = pd.get(0, 0);
    with_scalar = pd.get(1, 0);
    b = pd.get(2, 0.f);

    if (with_scalar != 0)
    {
        one_blob_only = true;
        support_inplace = true;
    }

    return 0;
}